

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O2

uint32_t FixedPointInterpolation(int v,uint32_t *tab,int tab_pos_shift_right,int tab_value_shift)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  
  bVar4 = (byte)tab_pos_shift_right;
  uVar1 = v >> (bVar4 & 0x1f);
  if (tab_pos_shift_right < 1) {
    uVar1 = v << (-bVar4 & 0x1f);
  }
  iVar6 = 0;
  if (0 < tab_pos_shift_right) {
    iVar6 = 1 << (bVar4 - 1 & 0x1f);
  }
  bVar5 = (byte)tab_value_shift;
  iVar3 = (int)tab[uVar1 + 1] >> (-bVar5 & 0x1f);
  iVar2 = (int)tab[uVar1] >> (-bVar5 & 0x1f);
  if (-1 < tab_value_shift) {
    iVar3 = tab[uVar1 + 1] << (bVar5 & 0x1f);
    iVar2 = tab[uVar1] << (bVar5 & 0x1f);
  }
  return ((iVar3 - iVar2) * (v - (uVar1 << (bVar4 & 0x1f))) + iVar6 >> (bVar4 & 0x1f)) + iVar2;
}

Assistant:

static WEBP_INLINE uint32_t FixedPointInterpolation(int v, uint32_t* tab,
                                                    int tab_pos_shift_right,
                                                    int tab_value_shift) {
  const uint32_t tab_pos = Shift(v, -tab_pos_shift_right);
  // fractional part, in 'tab_pos_shift' fixed-point precision
  const uint32_t x = v - (tab_pos << tab_pos_shift_right);  // fractional part
  // v0 / v1 are in kGammaToLinearBits fixed-point precision (range [0..1])
  const uint32_t v0 = Shift(tab[tab_pos + 0], tab_value_shift);
  const uint32_t v1 = Shift(tab[tab_pos + 1], tab_value_shift);
  // Final interpolation.
  const uint32_t v2 = (v1 - v0) * x;  // note: v1 >= v0.
  const int half =
      (tab_pos_shift_right > 0) ? 1 << (tab_pos_shift_right - 1) : 0;
  const uint32_t result = v0 + ((v2 + half) >> tab_pos_shift_right);
  return result;
}